

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha256.cpp
# Opt level: O0

string * SHA256AutoDetect_abi_cxx11_(UseImplementation use_implementation)

{
  byte in_SIL;
  string *in_RDI;
  long in_FS_OFFSET;
  bool bVar1;
  bool enabled_avx;
  bool have_x86_shani;
  bool have_avx2;
  bool have_avx;
  bool have_xsave;
  bool have_sse4;
  string *ret;
  uint32_t edx;
  uint32_t ecx;
  uint32_t ebx;
  uint32_t eax;
  char *in_stack_ffffffffffffff90;
  undefined6 in_stack_ffffffffffffff98;
  undefined1 in_stack_ffffffffffffff9e;
  undefined1 in_stack_ffffffffffffff9f;
  string *b;
  allocator<char> *a;
  uint32_t in_stack_ffffffffffffffb8;
  ushort in_stack_ffffffffffffffbc;
  uint leaf;
  bool local_40;
  bool local_3d;
  allocator<char> *in_stack_ffffffffffffffc8;
  undefined6 in_stack_ffffffffffffffd0;
  undefined1 uVar2;
  string *this;
  uint local_18;
  uint local_14;
  allocator<char> local_9;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  uVar2 = 0;
  a = &local_9;
  b = in_RDI;
  this = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this,(char *)CONCAT17(in_SIL,CONCAT16(uVar2,in_stack_ffffffffffffffd0)),
             in_stack_ffffffffffffffc8);
  std::allocator<char>::~allocator(&local_9);
  (anonymous_namespace)::Transform = anon_unknown.dwarf_1ed46f2::sha256::Transform;
  (anonymous_namespace)::TransformD64 = anon_unknown.dwarf_1ed46f2::sha256::TransformD64;
  (anonymous_namespace)::TransformD64_2way = (code *)0x0;
  (anonymous_namespace)::TransformD64_4way = (code *)0x0;
  (anonymous_namespace)::TransformD64_8way = (code *)0x0;
  local_40 = false;
  leaf = (uint)in_stack_ffffffffffffffbc;
  GetCPUID(leaf,in_stack_ffffffffffffffb8,(uint32_t *)a,(uint32_t *)b,(uint32_t *)in_RDI,
           (uint32_t *)
           CONCAT17(in_stack_ffffffffffffff9f,
                    CONCAT16(in_stack_ffffffffffffff9e,in_stack_ffffffffffffff98)));
  local_3d = (in_SIL & 1) != 0 && (local_18 >> 0x13 & 1) != 0;
  bVar1 = (local_18 >> 0x1c & 1) != 0;
  if (((local_18 >> 0x1b & 1) != 0) && (bVar1)) {
    in_stack_ffffffffffffff9f = anon_unknown.dwarf_1ed46f2::AVXEnabled();
    leaf = CONCAT13((char)(leaf >> 0x18),CONCAT12(in_stack_ffffffffffffff9f,(short)leaf));
  }
  if (local_3d) {
    GetCPUID(leaf,in_stack_ffffffffffffffb8,(uint32_t *)a,(uint32_t *)b,(uint32_t *)in_RDI,
             (uint32_t *)
             CONCAT17(in_stack_ffffffffffffff9f,
                      CONCAT16(in_stack_ffffffffffffff9e,in_stack_ffffffffffffff98)));
    local_40 = (in_SIL & 2) != 0 && (local_14 >> 5 & 1) != 0;
    if ((in_SIL & 4) != 0) {
      leaf = CONCAT13((local_14 >> 0x1d & 1) != 0,(int3)leaf);
    }
  }
  if ((leaf & 0x1000000) != 0) {
    (anonymous_namespace)::Transform = sha256_x86_shani::Transform;
    (anonymous_namespace)::TransformD64 =
         anon_unknown.dwarf_1ed46f2::TransformD64Wrapper<&sha256_x86_shani::Transform>;
    (anonymous_namespace)::TransformD64_2way = sha256d64_x86_shani::Transform_2way;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffffff9f,
                        CONCAT16(in_stack_ffffffffffffff9e,in_stack_ffffffffffffff98)),
               in_stack_ffffffffffffff90);
    local_3d = false;
    local_40 = false;
  }
  if (local_3d) {
    (anonymous_namespace)::Transform = sha256_sse4::Transform;
    (anonymous_namespace)::TransformD64 =
         anon_unknown.dwarf_1ed46f2::TransformD64Wrapper<&sha256_sse4::Transform>;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffffff9f,
                        CONCAT16(in_stack_ffffffffffffff9e,in_stack_ffffffffffffff98)),
               in_stack_ffffffffffffff90);
    (anonymous_namespace)::TransformD64_4way = sha256d64_sse41::Transform_4way;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffffff9f,
                        CONCAT16(in_stack_ffffffffffffff9e,in_stack_ffffffffffffff98)),
               in_stack_ffffffffffffff90);
  }
  if (((local_40) && (bVar1)) && ((leaf & 0x10000) != 0)) {
    (anonymous_namespace)::TransformD64_8way = sha256d64_avx2::Transform_8way;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffffff9f,
                        CONCAT16(in_stack_ffffffffffffff9e,in_stack_ffffffffffffff98)),
               in_stack_ffffffffffffff90);
  }
  bVar1 = anon_unknown.dwarf_1ed46f2::SelfTest();
  if (bVar1) {
    if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
      __stack_chk_fail();
    }
    return in_RDI;
  }
  __assert_fail("SelfTest()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/crypto/sha256.cpp"
                ,0x2b2,"std::string SHA256AutoDetect(sha256_implementation::UseImplementation)");
}

Assistant:

std::string SHA256AutoDetect(sha256_implementation::UseImplementation use_implementation)
{
    std::string ret = "standard";
    Transform = sha256::Transform;
    TransformD64 = sha256::TransformD64;
    TransformD64_2way = nullptr;
    TransformD64_4way = nullptr;
    TransformD64_8way = nullptr;

#if !defined(DISABLE_OPTIMIZED_SHA256)
#if defined(HAVE_GETCPUID)
    bool have_sse4 = false;
    bool have_xsave = false;
    bool have_avx = false;
    [[maybe_unused]] bool have_avx2 = false;
    [[maybe_unused]] bool have_x86_shani = false;
    [[maybe_unused]] bool enabled_avx = false;

    uint32_t eax, ebx, ecx, edx;
    GetCPUID(1, 0, eax, ebx, ecx, edx);
    if (use_implementation & sha256_implementation::USE_SSE4) {
        have_sse4 = (ecx >> 19) & 1;
    }
    have_xsave = (ecx >> 27) & 1;
    have_avx = (ecx >> 28) & 1;
    if (have_xsave && have_avx) {
        enabled_avx = AVXEnabled();
    }
    if (have_sse4) {
        GetCPUID(7, 0, eax, ebx, ecx, edx);
        if (use_implementation & sha256_implementation::USE_AVX2) {
            have_avx2 = (ebx >> 5) & 1;
        }
        if (use_implementation & sha256_implementation::USE_SHANI) {
            have_x86_shani = (ebx >> 29) & 1;
        }
    }

#if defined(ENABLE_SSE41) && defined(ENABLE_X86_SHANI)
    if (have_x86_shani) {
        Transform = sha256_x86_shani::Transform;
        TransformD64 = TransformD64Wrapper<sha256_x86_shani::Transform>;
        TransformD64_2way = sha256d64_x86_shani::Transform_2way;
        ret = "x86_shani(1way,2way)";
        have_sse4 = false; // Disable SSE4/AVX2;
        have_avx2 = false;
    }
#endif

    if (have_sse4) {
#if defined(__x86_64__) || defined(__amd64__)
        Transform = sha256_sse4::Transform;
        TransformD64 = TransformD64Wrapper<sha256_sse4::Transform>;
        ret = "sse4(1way)";
#endif
#if defined(ENABLE_SSE41)
        TransformD64_4way = sha256d64_sse41::Transform_4way;
        ret += ",sse41(4way)";
#endif
    }

#if defined(ENABLE_AVX2)
    if (have_avx2 && have_avx && enabled_avx) {
        TransformD64_8way = sha256d64_avx2::Transform_8way;
        ret += ",avx2(8way)";
    }
#endif
#endif // defined(HAVE_GETCPUID)

#if defined(ENABLE_ARM_SHANI)
    bool have_arm_shani = false;
    if (use_implementation & sha256_implementation::USE_SHANI) {
#if defined(__linux__)
#if defined(__arm__) // 32-bit
        if (getauxval(AT_HWCAP2) & HWCAP2_SHA2) {
            have_arm_shani = true;
        }
#endif
#if defined(__aarch64__) // 64-bit
        if (getauxval(AT_HWCAP) & HWCAP_SHA2) {
            have_arm_shani = true;
        }
#endif
#endif

#if defined(__APPLE__)
        int val = 0;
        size_t len = sizeof(val);
        if (sysctlbyname("hw.optional.arm.FEAT_SHA256", &val, &len, nullptr, 0) == 0) {
            have_arm_shani = val != 0;
        }
#endif
    }

    if (have_arm_shani) {
        Transform = sha256_arm_shani::Transform;
        TransformD64 = TransformD64Wrapper<sha256_arm_shani::Transform>;
        TransformD64_2way = sha256d64_arm_shani::Transform_2way;
        ret = "arm_shani(1way,2way)";
    }
#endif
#endif // DISABLE_OPTIMIZED_SHA256

    assert(SelfTest());
    return ret;
}